

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ClockingBlockSymbol *
slang::ast::ClockingBlockSymbol::fromSyntax(Scope *scope,ClockingDeclarationSyntax *syntax)

{
  SourceRange range;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  ClockingBlockSymbol *this;
  Symbol *pSVar2;
  reference ppMVar3;
  ClockingDirectionSyntax *pCVar4;
  SyntaxNode *in_RSI;
  Diagnostic *in_RDI;
  SourceRange SVar5;
  Diagnostic *diag_1;
  Diagnostic *diag;
  ClockingDirectionSyntax *dir;
  MemberSyntax *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  ClockingSkewSyntax *outputSkew;
  ClockingSkewSyntax *inputSkew;
  ClockingBlockSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_000004c8;
  Scope *in_stack_000004d0;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffe68;
  Diagnostic *in_stack_fffffffffffffe70;
  SourceLocation in_stack_fffffffffffffe78;
  Diagnostic *in_stack_fffffffffffffe80;
  SourceLocation *in_stack_fffffffffffffe88;
  Token *in_stack_fffffffffffffe90;
  Compilation *in_stack_fffffffffffffe98;
  Diagnostic *in_stack_fffffffffffffea0;
  ClockingBlockSymbol *in_stack_fffffffffffffec0;
  Token local_128;
  SourceLocation local_118;
  undefined4 local_10c;
  SourceRange local_108;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Scope *in_stack_ffffffffffffff10;
  Compilation *in_stack_ffffffffffffff18;
  SourceLocation in_stack_ffffffffffffff20;
  SourceLocation in_stack_ffffffffffffff28;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_90;
  SyntaxNode *local_88;
  ClockingSkewSyntax *local_80;
  ClockingSkewSyntax *local_78;
  SourceRange local_70;
  undefined4 local_5c;
  SourceLocation in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb0;
  SourceLocation in_stack_ffffffffffffffb8;
  DiagCode in_stack_ffffffffffffffc4;
  
  Scope::getCompilation((Scope *)in_RDI);
  parsing::Token::valueText((Token *)in_stack_fffffffffffffe80);
  parsing::Token::location((Token *)&in_RSI[4].previewNode);
  this = BumpAllocator::
         emplace<slang::ast::ClockingBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   ((BumpAllocator *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe88);
  Symbol::setSyntax(&this->super_Symbol,in_RSI);
  if (*(short *)&in_RSI[3].parent == 0x86) {
    in_stack_fffffffffffffec0 = this;
    SVar5 = parsing::Token::range(in_stack_fffffffffffffe90);
    in_stack_ffffffffffffffb8 = SVar5.startLoc;
    in_stack_ffffffffffffffc4 = SVar5.endLoc._4_4_;
    range.endLoc = in_stack_ffffffffffffff28;
    range.startLoc = in_stack_ffffffffffffff20;
    Compilation::noteDefaultClocking
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (Symbol *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),range);
  }
  else if (*(short *)&in_RSI[3].parent == 0xb3) {
    in_stack_fffffffffffffea0 = in_RDI;
    SVar5 = parsing::Token::range(in_stack_fffffffffffffe90);
    in_stack_ffffffffffffffa8 = SVar5.startLoc;
    in_stack_ffffffffffffffb0 = SVar5.endLoc;
    SVar5.endLoc = in_stack_ffffffffffffff28;
    SVar5.startLoc = in_stack_ffffffffffffff20;
    Compilation::noteGlobalClocking
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (Symbol *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),SVar5);
    pSVar2 = Scope::asSymbol((Scope *)in_RDI);
    if (pSVar2->kind == GenerateBlock) {
      local_5c = 0x3f0006;
      local_70 = parsing::Token::range((Token *)in_RDI);
      sourceRange.endLoc = in_stack_ffffffffffffffb8;
      sourceRange.startLoc = in_stack_ffffffffffffffb0;
      Scope::addDiag((Scope *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc4,sourceRange);
    }
  }
  local_78 = (ClockingSkewSyntax *)0x0;
  local_80 = (ClockingSkewSyntax *)0x0;
  local_88 = in_RSI + 7;
  local_90._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffe68);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffe78);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe70,
                            (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe68), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppMVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_90);
    if (((*ppMVar3)->super_SyntaxNode).kind == DefaultSkewItem) {
      slang::syntax::SyntaxNode::as<slang::syntax::DefaultSkewItemSyntax>
                (&(*ppMVar3)->super_SyntaxNode);
      pCVar4 = not_null<slang::syntax::ClockingDirectionSyntax_*>::operator*
                         ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x3eb930);
      if (pCVar4->inputSkew != (ClockingSkewSyntax *)0x0) {
        if (local_78 == (ClockingSkewSyntax *)0x0) {
          local_78 = pCVar4->inputSkew;
        }
        else {
          in_stack_fffffffffffffe80 = in_RDI;
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffec0);
          sourceRange_00.endLoc = in_stack_ffffffffffffffb8;
          sourceRange_00.startLoc = in_stack_ffffffffffffffb0;
          Scope::addDiag((Scope *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc4,sourceRange_00
                        );
          slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffea0);
          parsing::Token::location((Token *)&stack0xffffffffffffff18);
          Diagnostic::addNote(in_stack_fffffffffffffe70,
                              SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0),
                              in_stack_fffffffffffffe78);
        }
      }
      if (pCVar4->outputSkew != (ClockingSkewSyntax *)0x0) {
        if (local_80 == (ClockingSkewSyntax *)0x0) {
          local_80 = pCVar4->outputSkew;
        }
        else {
          in_stack_fffffffffffffe70 = in_RDI;
          local_108 = slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)in_stack_fffffffffffffec0);
          sourceRange_01.endLoc = in_stack_ffffffffffffffb8;
          sourceRange_01.startLoc = in_stack_ffffffffffffffb0;
          in_stack_fffffffffffffe78 =
               (SourceLocation)
               Scope::addDiag((Scope *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc4,
                              sourceRange_01);
          local_10c = 0xa0001;
          local_128 = slang::syntax::SyntaxNode::getFirstToken
                                ((SyntaxNode *)in_stack_fffffffffffffea0);
          local_118 = parsing::Token::location(&local_128);
          Diagnostic::addNote(in_stack_fffffffffffffe70,
                              SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0),
                              in_stack_fffffffffffffe78);
        }
      }
    }
    else {
      Scope::addMembers(in_stack_000004d0,in_stack_000004c8);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_90);
  }
  this->inputSkewSyntax = local_78;
  this->outputSkewSyntax = local_80;
  return this;
}

Assistant:

ClockingBlockSymbol& ClockingBlockSymbol::fromSyntax(const Scope& scope,
                                                     const ClockingDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ClockingBlockSymbol>(comp, syntax.blockName.valueText(),
                                                    syntax.blockName.location());
    result->setSyntax(syntax);

    if (syntax.globalOrDefault.kind == TokenKind::DefaultKeyword)
        comp.noteDefaultClocking(scope, *result, syntax.clocking.range());
    else if (syntax.globalOrDefault.kind == TokenKind::GlobalKeyword) {
        comp.noteGlobalClocking(scope, *result, syntax.clocking.range());
        if (scope.asSymbol().kind == SymbolKind::GenerateBlock)
            scope.addDiag(diag::GlobalClockingGenerate, syntax.clocking.range());
    }

    const ClockingSkewSyntax* inputSkew = nullptr;
    const ClockingSkewSyntax* outputSkew = nullptr;

    for (auto item : syntax.items) {
        if (item->kind == SyntaxKind::DefaultSkewItem) {
            auto& dir = *item->as<DefaultSkewItemSyntax>().direction;
            if (dir.inputSkew) {
                if (inputSkew) {
                    auto& diag = scope.addDiag(diag::MultipleDefaultInputSkew,
                                               dir.inputSkew->sourceRange());
                    diag.addNote(diag::NotePreviousDefinition,
                                 inputSkew->getFirstToken().location());
                }
                else {
                    inputSkew = dir.inputSkew;
                }
            }

            if (dir.outputSkew) {
                if (outputSkew) {
                    auto& diag = scope.addDiag(diag::MultipleDefaultOutputSkew,
                                               dir.outputSkew->sourceRange());
                    diag.addNote(diag::NotePreviousDefinition,
                                 outputSkew->getFirstToken().location());
                }
                else {
                    outputSkew = dir.outputSkew;
                }
            }
        }
        else {
            result->addMembers(*item);
        }
    }

    result->inputSkewSyntax = inputSkew;
    result->outputSkewSyntax = outputSkew;

    return *result;
}